

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChDampingCosseratLinear::ComputeStress
          (ChDampingCosseratLinear *this,ChVector<double> *stress_n,ChVector<double> *stress_m,
          ChVector<double> *dstrain_e,ChVector<double> *dstrain_k)

{
  stress_n->m_data[0] = dstrain_e->m_data[0] * (this->R_e).m_data[0];
  stress_n->m_data[1] = dstrain_e->m_data[1] * (this->R_e).m_data[1];
  stress_n->m_data[2] = dstrain_e->m_data[2] * (this->R_e).m_data[2];
  stress_m->m_data[0] = dstrain_k->m_data[0] * (this->R_k).m_data[0];
  stress_m->m_data[1] = dstrain_k->m_data[1] * (this->R_k).m_data[1];
  stress_m->m_data[2] = dstrain_k->m_data[2] * (this->R_k).m_data[2];
  return;
}

Assistant:

void ChDampingCosseratLinear::ComputeStress(ChVector<>& stress_n,
                                            ChVector<>& stress_m,
                                            const ChVector<>& dstrain_e,
                                            const ChVector<>& dstrain_k) {
    stress_n.x() = dstrain_e.x() * R_e.x();
    stress_n.y() = dstrain_e.y() * R_e.y();
    stress_n.z() = dstrain_e.z() * R_e.z();
    stress_m.x() = dstrain_k.x() * R_k.x();
    stress_m.y() = dstrain_k.y() * R_k.y();
    stress_m.z() = dstrain_k.z() * R_k.z();
}